

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_double(CmdlineParser *this,string *longkey,double *dest,string *desc)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  add_double(this,'\0',longkey,&local_48,dest,desc);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CmdlineParser::add_double(const std::string& longkey,
                               double& dest, const std::string& desc) {
    return add_double(0, longkey, "", dest, desc);
}